

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O3

void * Abc_NtkBuildGlobalBdds
                 (Abc_Ntk_t *pNtk,int nBddSizeMax,int fDropInternal,int fReorder,int fReverse,
                 int fVerbose)

{
  long *plVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  DdManager *unique;
  int *piVar6;
  void *pvVar7;
  Abc_Obj_t *pAVar8;
  ProgressBar *pProgress;
  Vec_Ptr_t *pVVar9;
  DdNode *pDVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int Counter;
  int local_3c;
  long local_38;
  
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  if (pNtk->vAttrs->nSize < 8) {
LAB_002e67a7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (pNtk->vAttrs->pArray[7] != (void *)0x0) {
    __assert_fail("Abc_NtkGlobalBdd(pNtk) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                  ,0x148,"void *Abc_NtkBuildGlobalBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  unique = Cudd_Init(pNtk->vCis->nSize,0,0x100,0x40000,0);
  iVar12 = pNtk->vObjs->nSize;
  piVar6 = (int *)calloc(1,0x30);
  iVar12 = iVar12 + 1;
  *(DdManager **)(piVar6 + 4) = unique;
  *(code **)(piVar6 + 6) = Extra_StopManager;
  iVar5 = 0x10;
  if (iVar12 != 0) {
    iVar5 = iVar12;
  }
  *(code **)(piVar6 + 10) = Cudd_RecursiveDeref;
  *piVar6 = iVar5;
  pvVar7 = calloc(1,(long)iVar5 << 3);
  *(void **)(piVar6 + 2) = pvVar7;
  if (pNtk->vAttrs->nSize < 8) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  pNtk->vAttrs->pArray[7] = piVar6;
  if (fReorder != 0) {
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  }
  pAVar8 = Abc_AigConst1(pNtk);
  if (0 < (pAVar8->vFanouts).nSize) {
    pVVar9 = pAVar8->pNtk->vAttrs;
    if (pVVar9->nSize < 8) goto LAB_002e67a7;
    piVar6 = (int *)pVVar9->pArray[7];
    pvVar7 = *(void **)(piVar6 + 2);
    if (pvVar7 == (void *)0x0) {
LAB_002e67e5:
      __assert_fail("p->pArrayPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                    ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
    }
    if (*(long *)(piVar6 + 8) != 0) {
LAB_002e67c6:
      __assert_fail("p->pFuncStartObj == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                    ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
    }
    pDVar10 = unique->one;
    iVar12 = pAVar8->Id;
    iVar5 = *piVar6;
    if (iVar5 <= iVar12) {
      iVar17 = iVar12 + 10;
      if (iVar12 < iVar5 * 2) {
        iVar17 = iVar5 * 2;
      }
      if (iVar5 < iVar17) {
        pvVar7 = realloc(pvVar7,(long)iVar17 * 8);
        *(void **)(piVar6 + 2) = pvVar7;
        memset((void *)((long)pvVar7 + (long)*piVar6 * 8),0,((long)iVar17 - (long)*piVar6) * 8);
        *piVar6 = iVar17;
      }
    }
    *(DdNode **)((long)pvVar7 + (long)iVar12 * 8) = pDVar10;
    Cudd_Ref(pDVar10);
  }
  pVVar9 = pNtk->vCis;
  uVar11 = (ulong)(uint)pVVar9->nSize;
  if (0 < pVVar9->nSize) {
    iVar12 = -1;
    lVar13 = 0;
    do {
      plVar1 = (long *)pVVar9->pArray[lVar13];
      if (0 < *(int *)((long)plVar1 + 0x2c)) {
        lVar14 = (long)((int)uVar11 + iVar12);
        if (fReverse == 0) {
          lVar14 = lVar13;
        }
        if (*(int *)(*(long *)(*plVar1 + 0x1b0) + 4) < 8) goto LAB_002e67a7;
        piVar6 = *(int **)(*(long *)(*(long *)(*plVar1 + 0x1b0) + 8) + 0x38);
        pvVar7 = *(void **)(piVar6 + 2);
        if (pvVar7 == (void *)0x0) goto LAB_002e67e5;
        if (*(long *)(piVar6 + 8) != 0) goto LAB_002e67c6;
        pDVar10 = unique->vars[lVar14];
        iVar5 = (int)plVar1[2];
        iVar17 = *piVar6;
        if (iVar17 <= iVar5) {
          iVar18 = iVar5 + 10;
          if (iVar5 < iVar17 * 2) {
            iVar18 = iVar17 * 2;
          }
          if (iVar17 < iVar18) {
            local_38 = (long)iVar18;
            pvVar7 = realloc(pvVar7,local_38 * 8);
            *(void **)(piVar6 + 2) = pvVar7;
            memset((void *)((long)pvVar7 + (long)*piVar6 * 8),0,(local_38 - *piVar6) * 8);
            *piVar6 = iVar18;
          }
        }
        *(DdNode **)((long)pvVar7 + (long)iVar5 * 8) = pDVar10;
        Cudd_Ref(pDVar10);
        pVVar9 = pNtk->vCis;
      }
      lVar13 = lVar13 + 1;
      uVar11 = (ulong)pVVar9->nSize;
      iVar12 = iVar12 + -1;
    } while (lVar13 < (long)uVar11);
  }
  local_3c = 0;
  pProgress = Extra_ProgressBarStart(_stdout,pNtk->nObjCounts[7]);
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      plVar1 = (long *)pVVar9->pArray[lVar13];
      pDVar10 = Abc_NodeGlobalBdds_rec
                          (unique,*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)plVar1[4] * 8),nBddSizeMax,fDropInternal,pProgress,
                           &local_3c,fVerbose);
      if (pDVar10 == (DdNode *)0x0) {
        if (fVerbose != 0) {
          puts("Constructing global BDDs is aborted.");
        }
        Abc_NtkAttrFree(pNtk,7,0);
        Cudd_Quit(unique);
        pVVar9 = pNtk->vObjs;
        iVar12 = pVVar9->nSize;
        lVar13 = (long)iVar12;
        if (0 < lVar13) {
          ppvVar2 = pVVar9->pArray;
          lVar14 = 0;
          do {
            pvVar7 = ppvVar2[lVar14];
            if ((((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xe) != 8)) &&
                (uVar15 = *(uint *)((long)pvVar7 + 0x14) & 0xf, uVar15 != 4)) && (uVar15 != 10)) {
              *(undefined4 *)((long)pvVar7 + 0x2c) = 0;
            }
            lVar14 = lVar14 + 1;
          } while (lVar13 != lVar14);
          if (0 < iVar12) {
            ppvVar2 = pVVar9->pArray;
            lVar14 = 0;
            do {
              plVar1 = (long *)ppvVar2[lVar14];
              if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xe) != 8)) &&
                 ((uVar15 = *(uint *)((long)plVar1 + 0x14) & 0xf, uVar15 != 5 &&
                  ((uVar15 != 10 && (iVar12 = *(int *)((long)plVar1 + 0x1c), 0 < (long)iVar12))))))
              {
                lVar3 = plVar1[4];
                lVar4 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
                lVar16 = 0;
                do {
                  piVar6 = (int *)(*(long *)(lVar4 + (long)*(int *)(lVar3 + lVar16 * 4) * 8) + 0x2c)
                  ;
                  *piVar6 = *piVar6 + 1;
                  lVar16 = lVar16 + 1;
                } while (iVar12 != lVar16);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != lVar13);
            return (void *)0x0;
          }
        }
        return (void *)0x0;
      }
      pDVar10 = (DdNode *)((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^ (ulong)pDVar10);
      Cudd_Ref(pDVar10);
      if (*(int *)(*(long *)(*plVar1 + 0x1b0) + 4) < 8) goto LAB_002e67a7;
      piVar6 = *(int **)(*(long *)(*(long *)(*plVar1 + 0x1b0) + 8) + 0x38);
      pvVar7 = *(void **)(piVar6 + 2);
      if (pvVar7 == (void *)0x0) goto LAB_002e67e5;
      if (*(long *)(piVar6 + 8) != 0) goto LAB_002e67c6;
      iVar12 = (int)plVar1[2];
      iVar5 = *piVar6;
      if (iVar5 <= iVar12) {
        iVar17 = iVar12 + 10;
        if (iVar12 < iVar5 * 2) {
          iVar17 = iVar5 * 2;
        }
        if (iVar5 < iVar17) {
          pvVar7 = realloc(pvVar7,(long)iVar17 * 8);
          *(void **)(piVar6 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar6 * 8),0,((long)iVar17 - (long)*piVar6) * 8);
          *piVar6 = iVar17;
        }
      }
      *(DdNode **)((long)pvVar7 + (long)iVar12 * 8) = pDVar10;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar13 < pVVar9->nSize);
  }
  Extra_ProgressBarStop(pProgress);
  pVVar9 = pNtk->vObjs;
  iVar12 = pVVar9->nSize;
  lVar13 = (long)iVar12;
  if (0 < lVar13) {
    ppvVar2 = pVVar9->pArray;
    lVar14 = 0;
    do {
      pvVar7 = ppvVar2[lVar14];
      if ((((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xe) != 8)) &&
          (uVar15 = *(uint *)((long)pvVar7 + 0x14) & 0xf, uVar15 != 4)) && (uVar15 != 10)) {
        *(undefined4 *)((long)pvVar7 + 0x2c) = 0;
      }
      lVar14 = lVar14 + 1;
    } while (lVar13 != lVar14);
    if (0 < iVar12) {
      ppvVar2 = pVVar9->pArray;
      lVar14 = 0;
      do {
        plVar1 = (long *)ppvVar2[lVar14];
        if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xe) != 8)) &&
           ((uVar15 = *(uint *)((long)plVar1 + 0x14) & 0xf, uVar15 != 5 &&
            ((uVar15 != 10 && (iVar12 = *(int *)((long)plVar1 + 0x1c), 0 < (long)iVar12)))))) {
          lVar3 = plVar1[4];
          lVar4 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
          lVar16 = 0;
          do {
            piVar6 = (int *)(*(long *)(lVar4 + (long)*(int *)(lVar3 + lVar16 * 4) * 8) + 0x2c);
            *piVar6 = *piVar6 + 1;
            lVar16 = lVar16 + 1;
          } while (iVar12 != lVar16);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar13);
    }
  }
  if (fReorder != 0) {
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,1);
    Cudd_AutodynDisable(unique);
  }
  return unique;
}

Assistant:

void * Abc_NtkBuildGlobalBdds( Abc_Ntk_t * pNtk, int nBddSizeMax, int fDropInternal, int fReorder, int fReverse, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Att_t * pAttMan;
    DdManager * dd;
    DdNode * bFunc;
    int i, k, Counter;

    // remove dangling nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );

    // start the manager
    assert( Abc_NtkGlobalBdd(pNtk) == NULL );
    dd = Cudd_Init( Abc_NtkCiNum(pNtk), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    pAttMan = Vec_AttAlloc( Abc_NtkObjNumMax(pNtk) + 1, dd, (void (*)(void*))Extra_StopManager, NULL, (void (*)(void*,void*))Cudd_RecursiveDeref );
    Vec_PtrWriteEntry( pNtk->vAttrs, VEC_ATTR_GLOBAL_BDD, pAttMan );

    // set reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

    // assign the constant node BDD
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
    {
        bFunc = dd->one;
        Abc_ObjSetGlobalBdd( pObj, bFunc );   Cudd_Ref( bFunc );
    }
    // set the elementary variables
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
        {
            bFunc = fReverse ? dd->vars[Abc_NtkCiNum(pNtk) - 1 - i] : dd->vars[i];
            Abc_ObjSetGlobalBdd( pObj, bFunc );  Cudd_Ref( bFunc );
        }

    // collect the global functions of the COs
    Counter = 0;
    // construct the BDDs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        bFunc = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin0(pObj), nBddSizeMax, fDropInternal, pProgress, &Counter, fVerbose );
        if ( bFunc == NULL )
        {
            if ( fVerbose )
            printf( "Constructing global BDDs is aborted.\n" );
            Abc_NtkFreeGlobalBdds( pNtk, 0 );
            Cudd_Quit( dd ); 

            // reset references
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
                    pObj->vFanouts.nSize = 0;
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
                    Abc_ObjForEachFanin( pObj, pFanin, k )
                        pFanin->vFanouts.nSize++;
            return NULL;
        }
        bFunc = Cudd_NotCond( bFunc, (int)Abc_ObjFaninC0(pObj) );  Cudd_Ref( bFunc ); 
        Abc_ObjSetGlobalBdd( pObj, bFunc );
    }
    Extra_ProgressBarStop( pProgress );

/*
    // derefence the intermediate BDDs
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( pObj->pCopy ) 
        {
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pCopy );
            pObj->pCopy = NULL;
        }
*/
/*
    // make sure all nodes are derefed
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->pCopy != NULL )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has BDD assigned\n", pObj->Id );
        if ( pObj->vFanouts.nSize > 0 )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has refs assigned\n", pObj->Id );
    }
*/
    // reset references
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
            pObj->vFanouts.nSize = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                pFanin->vFanouts.nSize++;

    // reorder one more time
    if ( fReorder )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 1 );
        Cudd_AutodynDisable( dd );
    }
//    Cudd_PrintInfo( dd, stdout );
    return dd;
}